

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<double>::default_cost_type
          (default_cost_type<double> *this,objective_function *obj_,int n)

{
  double dVar1;
  objective_function *this_00;
  bool bVar2;
  reference poVar3;
  type pdVar4;
  objective_function_element *elem;
  const_iterator __end3;
  const_iterator __begin3;
  vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  *__range3;
  int n_local;
  objective_function *obj__local;
  default_cost_type<double> *this_local;
  
  this->obj = obj_;
  std::make_unique<double[]>((size_t)&this->linear_elements);
  this_00 = this->obj;
  __end3 = std::
           vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ::begin(&this_00->elements);
  elem = (objective_function_element *)
         std::
         vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
         ::end(&this_00->elements);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                      (&__end3,(__normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                                *)&elem);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    poVar3 = __gnu_cxx::
             __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
             ::operator*(&__end3);
    bVar2 = false;
    if (-1 < poVar3->variable_index) {
      bVar2 = poVar3->variable_index < n;
    }
    if (!bVar2) break;
    dVar1 = poVar3->factor;
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)poVar3->variable_index);
    *pdVar4 = dVar1 + *pdVar4;
    __gnu_cxx::
    __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
    ::operator++(&__end3);
  }
  details::fail_fast("Postcondition","0 <= elem.variable_index && elem.variable_index < n",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"1011");
}

Assistant:

default_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        for (const auto& elem : obj.elements) {
            bx_ensures(0 <= elem.variable_index && elem.variable_index < n);

            linear_elements[elem.variable_index] +=
              static_cast<Float>(elem.factor);
        }
    }